

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuVfsAccess(sqlite3_vfs *pVfs,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  rbu_file *pFile;
  sqlite3_int64 sz;
  sqlite_int64 local_28;
  
  iVar1 = (**(code **)(*(long *)(pVfs + 1) + 0x38))();
  if (iVar1 == 0 && flags == 0) {
    pFile = rbuFindMaindb((rbu_vfs *)pVfs,zPath,1);
    iVar1 = 0;
    if ((((pFile != (rbu_file *)0x0) && (pFile->pRbu != (sqlite3rbu *)0x0)) &&
        (pFile->pRbu->eStage == 1)) && (iVar1 = 0xe, *pResOut == 0)) {
      local_28 = 0;
      iVar1 = rbuVfsFileSize(&pFile->base,&local_28);
      *pResOut = (uint)(0 < local_28);
    }
  }
  return iVar1;
}

Assistant:

static int rbuVfsAccess(
  sqlite3_vfs *pVfs, 
  const char *zPath, 
  int flags, 
  int *pResOut
){
  rbu_vfs *pRbuVfs = (rbu_vfs*)pVfs;
  sqlite3_vfs *pRealVfs = pRbuVfs->pRealVfs;
  int rc;

  rc = pRealVfs->xAccess(pRealVfs, zPath, flags, pResOut);

  /* If this call is to check if a *-wal file associated with an RBU target
  ** database connection exists, and the RBU update is in RBU_STAGE_OAL,
  ** the following special handling is activated:
  **
  **   a) if the *-wal file does exist, return SQLITE_CANTOPEN. This
  **      ensures that the RBU extension never tries to update a database
  **      in wal mode, even if the first page of the database file has
  **      been damaged. 
  **
  **   b) if the *-wal file does not exist, claim that it does anyway,
  **      causing SQLite to call xOpen() to open it. This call will also
  **      be intercepted (see the rbuVfsOpen() function) and the *-oal
  **      file opened instead.
  */
  if( rc==SQLITE_OK && flags==SQLITE_ACCESS_EXISTS ){
    rbu_file *pDb = rbuFindMaindb(pRbuVfs, zPath, 1);
    if( pDb && pDb->pRbu && pDb->pRbu->eStage==RBU_STAGE_OAL ){
      if( *pResOut ){
        rc = SQLITE_CANTOPEN;
      }else{
        sqlite3_int64 sz = 0;
        rc = rbuVfsFileSize(&pDb->base, &sz);
        *pResOut = (sz>0);
      }
    }
  }

  return rc;
}